

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

char * el::base::utils::Str::convertAndAddToBuff
                 (size_t n,int len,char *buf,char *bufLim,bool zeroPadded)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  ulong in_RDI;
  byte in_R8B;
  char *p;
  char localBuff [10];
  char *local_38;
  char local_2b [7];
  char local_24 [4];
  char *local_20;
  char *local_18;
  int local_c;
  ulong local_8;
  
  local_24[3] = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_2b,0,10);
  local_38 = local_24 + 1;
  if (local_8 == 0) {
    local_38 = local_24;
    local_24[0] = '0';
    local_c = local_c + -1;
  }
  else {
    while( true ) {
      bVar1 = false;
      if ((local_8 != 0) && (bVar1 = false, local_2b < local_38)) {
        bVar1 = 0 < local_c;
      }
      if (!bVar1) break;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_8;
      local_38[-1] = SUB161(auVar2 % ZEXT816(10),0) + '0';
      local_8 = local_8 / 10;
      local_c = local_c + -1;
      local_38 = local_38 + -1;
    }
  }
  if ((local_24[3] & 1U) != 0) {
    while( true ) {
      iVar3 = local_c;
      if (local_2b < local_38) {
        local_c = local_c + -1;
      }
      if (local_2b >= local_38 || iVar3 < 1) break;
      local_38[-1] = '0';
      local_38 = local_38 + -1;
    }
  }
  pcVar4 = addToBuff(local_38,local_18,local_20);
  return pcVar4;
}

Assistant:

char* Str::convertAndAddToBuff(std::size_t n, int len, char* buf, const char* bufLim, bool zeroPadded) {
  char localBuff[10] = "";
  char* p = localBuff + sizeof(localBuff) - 2;
  if (n > 0) {
    for (; n > 0 && p > localBuff && len > 0; n /= 10, --len)
      *--p = static_cast<char>(n % 10 + '0');
  } else {
    *--p = '0';
    --len;
  }
  if (zeroPadded)
    while (p > localBuff && len-- > 0) *--p = static_cast<char>('0');
  return addToBuff(p, buf, bufLim);
}